

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::MessageFieldGenerator
          (MessageFieldGenerator *this,FieldDescriptor *descriptor,int presenceIndex,
          Options *options)

{
  bool bVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar2;
  undefined **b;
  AlphaNum local_178;
  string local_148;
  AlphaNum local_128;
  string local_f8;
  AlphaNum local_d8;
  string local_a8;
  AlphaNum local_88;
  string local_58;
  Options *local_28;
  Options *options_local;
  FieldDescriptor *pFStack_18;
  int presenceIndex_local;
  FieldDescriptor *descriptor_local;
  MessageFieldGenerator *this_local;
  
  local_28 = options;
  options_local._4_4_ = presenceIndex;
  pFStack_18 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,presenceIndex,options);
  b = &PTR__MessageFieldGenerator_02a402f0;
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__MessageFieldGenerator_02a402f0;
  bVar1 = SupportsPresenceApi((this->super_FieldGeneratorBase).descriptor_);
  if (!bVar1) {
    FieldGeneratorBase::name_abi_cxx11_(&local_a8,&this->super_FieldGeneratorBase);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_88,&local_a8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,"_ != null");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_58,(lts_20250127 *)&local_88,&local_d8,(AlphaNum *)b);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[19],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&(this->super_FieldGeneratorBase).variables_,
                        (key_arg<char[19]> *)0x1fa15a9);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_a8);
    FieldGeneratorBase::name_abi_cxx11_(&local_148,&this->super_FieldGeneratorBase);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_128,&local_148);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_178,"_ == null");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_f8,(lts_20250127 *)&local_128,&local_178,(AlphaNum *)b);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&(this->super_FieldGeneratorBase).variables_,
                        (key_arg<char[23]> *)0x1fdb346);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_148);
  }
  return;
}

Assistant:

MessageFieldGenerator::MessageFieldGenerator(const FieldDescriptor* descriptor,
                                             int presenceIndex,
                                             const Options *options)
    : FieldGeneratorBase(descriptor, presenceIndex, options) {
  if (!SupportsPresenceApi(descriptor_)) {
    variables_["has_property_check"] = absl::StrCat(name(), "_ != null");
    variables_["has_not_property_check"] = absl::StrCat(name(), "_ == null");
  }
}